

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void icu_63::DateFormatSymbols::assignArray
               (UnicodeString **dstArray,int32_t *dstCount,UnicodeString *srcArray,int32_t srcCount)

{
  long *plVar1;
  UnicodeString *pUVar2;
  UMemory *this;
  long lVar3;
  long lVar4;
  
  *dstCount = srcCount;
  lVar3 = (long)(int)(srcCount + (uint)(srcCount == 0));
  lVar4 = lVar3 * 0x40;
  this = (UMemory *)0xffffffffffffffff;
  if (-1 < srcCount) {
    this = (UMemory *)(lVar4 + 8);
  }
  plVar1 = (long *)UMemory::operator_new__(this,(size_t)dstCount);
  if (plVar1 == (long *)0x0) {
    pUVar2 = (UnicodeString *)0x0;
  }
  else {
    *plVar1 = lVar3;
    pUVar2 = (UnicodeString *)(plVar1 + 1);
    lVar3 = 0;
    do {
      *(undefined ***)((long)plVar1 + lVar3 + 8) = &PTR__UnicodeString_0048be70;
      *(undefined2 *)((long)plVar1 + lVar3 + 0x10) = 2;
      lVar3 = lVar3 + 0x40;
    } while (lVar4 != lVar3);
  }
  *dstArray = pUVar2;
  if (0 < srcCount && pUVar2 != (UnicodeString *)0x0) {
    lVar3 = 0;
    do {
      icu_63::UnicodeString::fastCopyFrom
                ((UnicodeString *)
                 ((long)&((*dstArray)->super_Replaceable).super_UObject._vptr_UObject + lVar3),
                 (UnicodeString *)
                 ((long)&(srcArray->super_Replaceable).super_UObject._vptr_UObject + lVar3));
      lVar3 = lVar3 + 0x40;
    } while ((ulong)(uint)srcCount << 6 != lVar3);
  }
  return;
}

Assistant:

void
DateFormatSymbols::assignArray(UnicodeString*& dstArray,
                               int32_t& dstCount,
                               const UnicodeString* srcArray,
                               int32_t srcCount)
{
    // assignArray() is only called by copyData() and initializeData(), which in turn
    // implements the copy constructor and the assignment operator.
    // All strings in a DateFormatSymbols object are created in one of the following
    // three ways that all allow to safely use UnicodeString::fastCopyFrom():
    // - readonly-aliases from resource bundles
    // - readonly-aliases or allocated strings from constants
    // - safely cloned strings (with owned buffers) from setXYZ() functions
    //
    // Note that this is true for as long as DateFormatSymbols can be constructed
    // only from a locale bundle or set via the cloning API,
    // *and* for as long as all the strings are in *private* fields, preventing
    // a subclass from creating these strings in an "unsafe" way (with respect to fastCopyFrom()).
    dstCount = srcCount;
    dstArray = newUnicodeStringArray(srcCount);
    if(dstArray != NULL) {
        int32_t i;
        for(i=0; i<srcCount; ++i) {
            dstArray[i].fastCopyFrom(srcArray[i]);
        }
    }
}